

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::DiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  uint uVar8;
  undefined4 uVar9;
  RayHit *pRVar10;
  long lVar12;
  Scene *scene;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar19;
  float fVar20;
  undefined1 auVar17 [16];
  float fVar21;
  undefined1 auVar18 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  vbool<4> valid;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  undefined1 local_130 [8];
  undefined1 local_128 [16];
  RTCHitN local_118 [8];
  float local_110;
  float local_10c;
  float local_108;
  uint local_104;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_100 [2];
  RTCFilterFunctionNArguments local_e8;
  undefined1 local_b8 [16];
  float local_a8 [8];
  undefined1 local_88 [16];
  float local_78 [4];
  float local_68 [4];
  float local_58 [4];
  undefined1 local_48 [16];
  ulong uVar11;
  undefined1 auVar28 [64];
  
  pSVar4 = context->scene;
  pGVar5 = (pSVar4->geometries).items[Disc->sharedGeomID].ptr;
  lVar12 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar35 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[0] * _Var6);
  auVar13 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[1] * _Var6);
  auVar33 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[2] * _Var6);
  auVar26 = *(undefined1 (*) [16])(lVar12 + (Disc->primIDs).field_0.i[3] * _Var6);
  auVar15 = vunpcklps_avx(auVar35,auVar33);
  auVar18 = vunpckhps_avx(auVar35,auVar33);
  auVar35 = vunpcklps_avx(auVar13,auVar26);
  auVar34 = vunpckhps_avx(auVar13,auVar26);
  auVar26 = vunpcklps_avx(auVar15,auVar35);
  auVar13 = vunpckhps_avx(auVar15,auVar35);
  auVar35 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar33 = vpcmpgtd_avx(auVar35,_DAT_01ff0cf0);
  auVar35 = vunpcklps_avx(auVar18,auVar34);
  local_48 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar9 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar17._4_4_ = uVar9;
  auVar17._0_4_ = uVar9;
  auVar17._8_4_ = uVar9;
  auVar17._12_4_ = uVar9;
  auVar26 = vsubps_avx(auVar26,auVar17);
  uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar15._4_4_ = uVar9;
  auVar15._0_4_ = uVar9;
  auVar15._8_4_ = uVar9;
  auVar15._12_4_ = uVar9;
  auVar15 = vsubps_avx(auVar13,auVar15);
  uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar13._4_4_ = uVar9;
  auVar13._0_4_ = uVar9;
  auVar13._8_4_ = uVar9;
  auVar13._12_4_ = uVar9;
  auVar17 = vsubps_avx(auVar35,auVar13);
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar38 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar16 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar19 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar35 = ZEXT416((uint)(fVar16 * fVar16 + fVar19 * fVar19 + fVar38 * fVar38));
  auVar13 = vshufps_avx(auVar35,auVar35,0);
  auVar35 = vrcpps_avx(auVar13);
  fVar38 = auVar35._0_4_;
  auVar36._0_4_ = fVar38 * auVar13._0_4_;
  fVar41 = auVar35._4_4_;
  auVar36._4_4_ = fVar41 * auVar13._4_4_;
  fVar42 = auVar35._8_4_;
  auVar36._8_4_ = fVar42 * auVar13._8_4_;
  fVar43 = auVar35._12_4_;
  auVar36._12_4_ = fVar43 * auVar13._12_4_;
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = &DAT_3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  auVar35 = vsubps_avx(auVar44,auVar36);
  fVar29 = auVar17._0_4_;
  fVar30 = auVar17._4_4_;
  fVar31 = auVar17._8_4_;
  fVar32 = auVar17._12_4_;
  fVar22 = auVar15._0_4_;
  fVar23 = auVar15._4_4_;
  fVar24 = auVar15._8_4_;
  fVar25 = auVar15._12_4_;
  fVar16 = auVar26._0_4_;
  fVar19 = auVar26._4_4_;
  fVar20 = auVar26._8_4_;
  fVar21 = auVar26._12_4_;
  local_88._0_4_ =
       (fVar16 * fVar1 + fVar22 * fVar2 + fVar29 * fVar3) * (fVar38 + fVar38 * auVar35._0_4_);
  local_88._4_4_ =
       (fVar19 * fVar1 + fVar23 * fVar2 + fVar30 * fVar3) * (fVar41 + fVar41 * auVar35._4_4_);
  local_88._8_4_ =
       (fVar20 * fVar1 + fVar24 * fVar2 + fVar31 * fVar3) * (fVar42 + fVar42 * auVar35._8_4_);
  local_88._12_4_ =
       (fVar21 * fVar1 + fVar25 * fVar2 + fVar32 * fVar3) * (fVar43 + fVar43 * auVar35._12_4_);
  auVar45 = ZEXT1664(local_88);
  uVar9 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar35._4_4_ = uVar9;
  auVar35._0_4_ = uVar9;
  auVar35._8_4_ = uVar9;
  auVar35._12_4_ = uVar9;
  auVar35 = vcmpps_avx(auVar35,local_88,2);
  fVar38 = (ray->super_RayK<1>).tfar;
  auVar39._4_4_ = fVar38;
  auVar39._0_4_ = fVar38;
  auVar39._8_4_ = fVar38;
  auVar39._12_4_ = fVar38;
  auVar13 = vcmpps_avx(local_88,auVar39,2);
  auVar35 = vandps_avx(auVar13,auVar35);
  auVar13 = auVar33 & auVar35;
  if ((((auVar13 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar13 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar13[0xf] < '\0') {
    auVar35 = vandps_avx(auVar35,auVar33);
    auVar18 = vunpckhps_avx(auVar18,auVar34);
    auVar33._0_4_ = local_88._0_4_ * fVar1;
    auVar33._4_4_ = local_88._4_4_ * fVar1;
    auVar33._8_4_ = local_88._8_4_ * fVar1;
    auVar33._12_4_ = local_88._12_4_ * fVar1;
    auVar37._0_4_ = local_88._0_4_ * fVar2;
    auVar37._4_4_ = local_88._4_4_ * fVar2;
    auVar37._8_4_ = local_88._8_4_ * fVar2;
    auVar37._12_4_ = local_88._12_4_ * fVar2;
    auVar40._0_4_ = local_88._0_4_ * fVar3;
    auVar40._4_4_ = local_88._4_4_ * fVar3;
    auVar40._8_4_ = local_88._8_4_ * fVar3;
    auVar40._12_4_ = local_88._12_4_ * fVar3;
    auVar13 = vsubps_avx(auVar26,auVar33);
    auVar33 = vsubps_avx(auVar15,auVar37);
    auVar26 = vsubps_avx(auVar17,auVar40);
    auVar34._0_4_ =
         auVar33._0_4_ * auVar33._0_4_ + auVar26._0_4_ * auVar26._0_4_ +
         auVar13._0_4_ * auVar13._0_4_;
    auVar34._4_4_ =
         auVar33._4_4_ * auVar33._4_4_ + auVar26._4_4_ * auVar26._4_4_ +
         auVar13._4_4_ * auVar13._4_4_;
    auVar34._8_4_ =
         auVar33._8_4_ * auVar33._8_4_ + auVar26._8_4_ * auVar26._8_4_ +
         auVar13._8_4_ * auVar13._8_4_;
    auVar34._12_4_ =
         auVar33._12_4_ * auVar33._12_4_ + auVar26._12_4_ * auVar26._12_4_ +
         auVar13._12_4_ * auVar13._12_4_;
    auVar26._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar26._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar26._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar26._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar13 = vcmpps_avx(auVar34,auVar26,2);
    auVar33 = auVar35 & auVar13;
    if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0')
    {
      auVar35 = vandps_avx(auVar35,auVar13);
      auVar18._0_4_ = fVar16 * fVar16 + fVar22 * fVar22 + fVar29 * fVar29;
      auVar18._4_4_ = fVar19 * fVar19 + fVar23 * fVar23 + fVar30 * fVar30;
      auVar18._8_4_ = fVar20 * fVar20 + fVar24 * fVar24 + fVar31 * fVar31;
      auVar18._12_4_ = fVar21 * fVar21 + fVar25 * fVar25 + fVar32 * fVar32;
      auVar13 = vcmpps_avx(auVar18,auVar26,6);
      auVar33 = auVar13 & auVar35;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) {
        auVar35 = vandps_avx(auVar35,auVar13);
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        local_a8[2] = 0.0;
        local_a8[3] = 0.0;
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        local_78[0] = -fVar1;
        local_78[1] = -fVar1;
        local_78[2] = -fVar1;
        local_78[3] = -fVar1;
        local_68[0] = -fVar2;
        local_68[1] = -fVar2;
        local_68[2] = -fVar2;
        local_68[3] = -fVar2;
        local_58[0] = -fVar3;
        local_58[1] = -fVar3;
        local_58[2] = -fVar3;
        local_58[3] = -fVar3;
        local_128 = auVar35;
        auVar27._8_4_ = 0x7f800000;
        auVar27._0_8_ = 0x7f8000007f800000;
        auVar27._12_4_ = 0x7f800000;
        auVar28 = ZEXT1664(auVar27);
        auVar13 = vblendvps_avx(auVar27,local_88,auVar35);
        auVar33 = vshufps_avx(auVar13,auVar13,0xb1);
        auVar33 = vminps_avx(auVar33,auVar13);
        auVar26 = vshufpd_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar26,auVar33);
        auVar13 = vcmpps_avx(auVar13,auVar33,0);
        auVar33 = auVar35 & auVar13;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar35 = vandps_avx(auVar13,auVar35);
        }
        uVar8 = vmovmskps_avx(auVar35);
        lVar12 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        do {
          local_100[0]._0_4_ = *(undefined4 *)(local_48 + lVar12 * 4);
          pRVar10 = (RayHit *)(ulong)(uint)local_100[0]._0_4_;
          pGVar5 = (pSVar4->geometries).items[(long)pRVar10].ptr;
          if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
            *(undefined4 *)(local_118 + lVar12 * 4 + -0x10) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar1 = local_a8[lVar12];
              fVar2 = local_a8[lVar12 + 4];
              (ray->super_RayK<1>).tfar = local_78[lVar12 + -4];
              (ray->Ng).field_0.field_0.x = local_78[lVar12];
              (ray->Ng).field_0.field_0.y = local_68[lVar12];
              (ray->Ng).field_0.field_0.z = local_58[lVar12];
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = (Disc->primIDs).field_0.i[lVar12];
              ray->geomID = local_100[0]._0_4_;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            local_118._0_4_ = local_78[lVar12];
            local_118._4_4_ = local_68[lVar12];
            local_110 = local_58[lVar12];
            local_10c = local_a8[lVar12];
            local_108 = local_a8[lVar12 + 4];
            local_104 = (Disc->primIDs).field_0.i[lVar12];
            local_100[0].field_0.y = context->user->instID[0];
            local_100[0].field_0.z = context->user->instPrimID[0];
            local_130._4_4_ = (ray->super_RayK<1>).tfar;
            (ray->super_RayK<1>).tfar = local_78[lVar12 + -4];
            local_130._0_4_ = -NAN;
            local_e8.valid = (int *)local_130;
            local_e8.geometryUserPtr = pGVar5->userPtr;
            local_e8.context = context->user;
            local_e8.ray = (RTCRayN *)ray;
            local_e8.hit = local_118;
            local_e8.N = 1;
            local_b8 = auVar45._0_16_;
            if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00ea30ff:
              p_Var7 = context->args->filter;
              if (p_Var7 != (RTCFilterFunctionN)0x0) {
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                {
                  (*p_Var7)(&local_e8);
                  auVar28 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  auVar45 = ZEXT1664(local_b8);
                }
                if ((((RayK<1> *)local_e8.valid)->org).field_0.m128[0] == 0.0) goto LAB_00ea31f4;
              }
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.x = *(float *)local_e8.hit;
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_e8.hit + 4);
              (((Vec3f *)((long)local_e8.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_e8.hit + 8);
              *(float *)((long)local_e8.ray + 0x3c) = *(float *)(local_e8.hit + 0xc);
              *(float *)((long)local_e8.ray + 0x40) = *(float *)(local_e8.hit + 0x10);
              *(uint *)((long)local_e8.ray + 0x44) = *(uint *)(local_e8.hit + 0x14);
              *(uint *)((long)local_e8.ray + 0x48) = *(uint *)(local_e8.hit + 0x18);
              *(uint *)((long)local_e8.ray + 0x4c) = *(uint *)(local_e8.hit + 0x1c);
              *(uint *)((long)local_e8.ray + 0x50) = *(uint *)(local_e8.hit + 0x20);
              pRVar10 = (RayHit *)local_e8.ray;
            }
            else {
              (*pGVar5->intersectionFilterN)(&local_e8);
              auVar28 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar45 = ZEXT1664(local_b8);
              if ((((RayK<1> *)local_e8.valid)->org).field_0.m128[0] != 0.0) goto LAB_00ea30ff;
LAB_00ea31f4:
              (ray->super_RayK<1>).tfar = (float)local_130._4_4_;
              pRVar10 = (RayHit *)local_e8.valid;
            }
            *(undefined4 *)(local_118 + lVar12 * 4 + -0x10) = 0;
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar14._4_4_ = fVar1;
            auVar14._0_4_ = fVar1;
            auVar14._8_4_ = fVar1;
            auVar14._12_4_ = fVar1;
            auVar35 = vcmpps_avx(auVar45._0_16_,auVar14,2);
            local_128 = vandps_avx(auVar35,local_128);
          }
          if ((((local_128 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (local_128 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (local_128 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < local_128[0xf]) {
            return;
          }
          auVar35 = vblendvps_avx(auVar28._0_16_,auVar45._0_16_,local_128);
          auVar13 = vshufps_avx(auVar35,auVar35,0xb1);
          auVar13 = vminps_avx(auVar13,auVar35);
          auVar33 = vshufpd_avx(auVar13,auVar13,1);
          auVar13 = vminps_avx(auVar33,auVar13);
          auVar13 = vcmpps_avx(auVar35,auVar13,0);
          auVar33 = local_128 & auVar13;
          auVar35 = local_128;
          if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar33[0xf] < '\0') {
            auVar35 = vandps_avx(auVar13,local_128);
          }
          uVar9 = vmovmskps_avx(auVar35);
          uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
          lVar12 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }